

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poller.cpp
# Opt level: O3

int __thiscall hwnet::Poller::Add(Poller *this,Ptr *channel,int flag)

{
  int iVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  int local_40;
  int local_3c;
  pthread_mutex_t *local_38;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar1 == 0) {
    local_38 = (pthread_mutex_t *)&this->mtx;
    local_40 = (*((channel->super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                 ->_vptr_Channel[1])();
    iVar2 = std::
            _Hashtable<int,_std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->channels)._M_h,&local_40);
    iVar1 = -1;
    if (iVar2.
        super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>,_false>.
        _M_cur == (__node_type *)0x0) {
      iVar1 = Epoll::Add(&this->poller_,channel,flag);
      if (iVar1 == 0) {
        local_3c = (*((channel->super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->_vptr_Channel[1])();
        pmVar3 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<int,_std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->channels,&local_3c);
        (pmVar3->super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (channel->super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(pmVar3->super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount,
                   &(channel->super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount);
        iVar1 = 0;
      }
    }
    pthread_mutex_unlock(local_38);
    return iVar1;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

int Poller::Add(const Channel::Ptr &channel,int flag) {
	std::lock_guard<std::mutex> guard(this->mtx);
	if(this->channels.find(channel->Fd()) != this->channels.end()) {
		return -1;
	} else {
		int ret = poller_.Add(channel,flag);
		if(0 == ret) {
			this->channels[channel->Fd()] = channel;
		}
		return ret;
	}
}